

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checkbox.cpp
# Opt level: O2

void __thiscall cursespp::Checkbox::Checkbox(Checkbox *this)

{
  TextLabel::TextLabel(&this->super_TextLabel);
  (this->super_TextLabel).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__Checkbox_001bdf88;
  (this->super_TextLabel).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__Checkbox_001be1a8;
  (this->super_TextLabel).super_Window.super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__Checkbox_001be1d8;
  (this->super_TextLabel).super_Window.super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__Checkbox_001be200;
  (this->super_TextLabel).super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__Checkbox_001be228;
  sigslot::signal2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>::signal2
            (&this->CheckChanged);
  this->checked = false;
  (this->originalText)._M_dataplus._M_p = (pointer)&(this->originalText).field_2;
  (this->originalText)._M_string_length = 0;
  (this->originalText).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Checkbox::Checkbox()
: TextLabel()
, checked(false) {
}